

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O2

ScriptBuilder * __thiscall
cfd::core::ScriptBuilder::AppendData(ScriptBuilder *this,ByteData256 *data)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_datas;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  ByteData256::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28,data);
  WallyUtil::CreateScriptDataFromBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28,0);
  ::std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (local_40._M_impl.super__Vector_impl_data._M_start,
             local_40._M_impl.super__Vector_impl_data._M_finish,
             (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
             &this->script_byte_array_);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
  return this;
}

Assistant:

ScriptBuilder& ScriptBuilder::AppendData(const ByteData256& data) {
  const std::vector<uint8_t>& byte_array = data.GetBytes();
  std::vector<uint8_t> byte_datas =
      WallyUtil::CreateScriptDataFromBytes(byte_array);
  std::copy(
      byte_datas.begin(), byte_datas.end(),
      std::back_inserter(script_byte_array_));
  return *this;
}